

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_writer.cpp
# Opt level: O2

unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
__thiscall
duckdb::ListColumnWriter::InitializeWriteState(ListColumnWriter *this,RowGroup *row_group)

{
  _Head_base<0UL,_duckdb::ColumnWriterState_*,_false> _Var1;
  _Head_base<0UL,_duckdb::ColumnWriterState_*,_false> _Var2;
  pointer pCVar3;
  pointer pLVar4;
  RowGroup *in_RDX;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::ColumnWriterState_*,_false> local_28;
  _Head_base<0UL,_duckdb::ListColumnWriterState_*,_false> local_20;
  
  local_28._M_head_impl =
       (ColumnWriterState *)
       (((long)(in_RDX->columns).
               super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
               .
               super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)(in_RDX->columns).
              super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
              .
              super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x280);
  make_uniq<duckdb::ListColumnWriterState,duckdb_parquet::RowGroup&,unsigned_long>
            ((duckdb *)&local_20,in_RDX,(unsigned_long *)&local_28);
  pCVar3 = unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>::
           operator->((unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>
                       *)&(row_group->sorting_columns).
                          super_vector<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>
                          .
                          super__Vector_base<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
  (*pCVar3->_vptr_ColumnWriter[2])(&local_28,pCVar3);
  pLVar4 = unique_ptr<duckdb::ListColumnWriterState,_std::default_delete<duckdb::ListColumnWriterState>,_true>
           ::operator->((unique_ptr<duckdb::ListColumnWriterState,_std::default_delete<duckdb::ListColumnWriterState>,_true>
                         *)&local_20);
  _Var2._M_head_impl = local_28._M_head_impl;
  local_28._M_head_impl = (ColumnWriterState *)0x0;
  _Var1._M_head_impl =
       (pLVar4->child_state).
       super_unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnWriterState_*,_std::default_delete<duckdb::ColumnWriterState>_>
       .super__Head_base<0UL,_duckdb::ColumnWriterState_*,_false>._M_head_impl;
  (pLVar4->child_state).
  super_unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>._M_t.
  super___uniq_ptr_impl<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnWriterState_*,_std::default_delete<duckdb::ColumnWriterState>_>
  .super__Head_base<0UL,_duckdb::ColumnWriterState_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (ColumnWriterState *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_ColumnWriterState + 8))();
    if (local_28._M_head_impl != (ColumnWriterState *)0x0) {
      (*(local_28._M_head_impl)->_vptr_ColumnWriterState[1])();
    }
  }
  (this->super_ColumnWriter)._vptr_ColumnWriter = (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>)
         (unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>)
         this;
}

Assistant:

unique_ptr<ColumnWriterState> ListColumnWriter::InitializeWriteState(duckdb_parquet::RowGroup &row_group) {
	auto result = make_uniq<ListColumnWriterState>(row_group, row_group.columns.size());
	result->child_state = child_writer->InitializeWriteState(row_group);
	return std::move(result);
}